

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O2

void __thiscall
duckdb::AttachOptions::AttachOptions
          (AttachOptions *this,
          unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true> *info,
          AccessMode default_access_mode)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  pointer pAVar2;
  string *input;
  mapped_type *this_00;
  __node_base *p_Var3;
  LogicalType local_e8;
  Value local_d0;
  QualifiedName local_90;
  
  this->access_mode = default_access_mode;
  (this->db_type)._M_dataplus._M_p = (pointer)&(this->db_type).field_2;
  (this->db_type)._M_string_length = 0;
  (this->db_type).field_2._M_local_buf[0] = '\0';
  (this->options)._M_h._M_buckets = &(this->options)._M_h._M_single_bucket;
  (this->options)._M_h._M_bucket_count = 1;
  (this->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->options)._M_h._M_element_count = 0;
  (this->options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->options)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  QualifiedName::QualifiedName(&this->default_table);
  pAVar2 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     (info);
  p_Var3 = &(pAVar2->options)._M_h._M_before_begin;
  do {
    while( true ) {
      p_Var3 = p_Var3->_M_nxt;
      if (p_Var3 == (__node_base *)0x0) {
        return;
      }
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1);
      bVar1 = ::std::operator==(__lhs,"readonly");
      if (!bVar1) break;
LAB_00439a03:
      LogicalType::LogicalType(&local_d0.type_,BOOLEAN);
      Value::DefaultCastAs((Value *)&local_90,(Value *)(p_Var3 + 5),&local_d0.type_,false);
      bVar1 = BooleanValue::Get((Value *)&local_90);
      Value::~Value((Value *)&local_90);
      LogicalType::~LogicalType(&local_d0.type_);
      this->access_mode = bVar1 ^ READ_WRITE;
    }
    bVar1 = ::std::operator==(__lhs,"read_only");
    if (bVar1) goto LAB_00439a03;
    bVar1 = ::std::operator==(__lhs,"readwrite");
    if (bVar1) {
LAB_00439a68:
      LogicalType::LogicalType(&local_d0.type_,BOOLEAN);
      Value::DefaultCastAs((Value *)&local_90,(Value *)(p_Var3 + 5),&local_d0.type_,false);
      bVar1 = BooleanValue::Get((Value *)&local_90);
      Value::~Value((Value *)&local_90);
      LogicalType::~LogicalType(&local_d0.type_);
      this->access_mode = bVar1 | READ_ONLY;
    }
    else {
      bVar1 = ::std::operator==(__lhs,"read_write");
      if (bVar1) goto LAB_00439a68;
      bVar1 = ::std::operator==(__lhs,"type");
      if (bVar1) {
        LogicalType::LogicalType(&local_d0.type_,VARCHAR);
        Value::DefaultCastAs((Value *)&local_90,(Value *)(p_Var3 + 5),&local_d0.type_,false);
        StringValue::Get_abi_cxx11_((Value *)&local_90);
        ::std::__cxx11::string::_M_assign((string *)&this->db_type);
        Value::~Value((Value *)&local_90);
        LogicalType::~LogicalType(&local_d0.type_);
      }
      else {
        bVar1 = ::std::operator==(__lhs,"default_table");
        if (bVar1) {
          LogicalType::LogicalType(&local_e8,VARCHAR);
          Value::DefaultCastAs(&local_d0,(Value *)(p_Var3 + 5),&local_e8,false);
          input = StringValue::Get_abi_cxx11_(&local_d0);
          QualifiedName::Parse(&local_90,input);
          QualifiedName::operator=(&this->default_table,&local_90);
          QualifiedName::~QualifiedName(&local_90);
          Value::~Value(&local_d0);
          LogicalType::~LogicalType(&local_e8);
        }
        else {
          this_00 = ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->options,__lhs);
          Value::operator=(this_00,(Value *)(p_Var3 + 5));
        }
      }
    }
  } while( true );
}

Assistant:

AttachOptions::AttachOptions(const unique_ptr<AttachInfo> &info, const AccessMode default_access_mode)
    : access_mode(default_access_mode) {

	for (auto &entry : info->options) {
		if (entry.first == "readonly" || entry.first == "read_only") {
			// Extract the read access mode.

			auto read_only = BooleanValue::Get(entry.second.DefaultCastAs(LogicalType::BOOLEAN));
			if (read_only) {
				access_mode = AccessMode::READ_ONLY;
			} else {
				access_mode = AccessMode::READ_WRITE;
			}
			continue;
		}

		if (entry.first == "readwrite" || entry.first == "read_write") {
			// Extract the write access mode.
			auto read_write = BooleanValue::Get(entry.second.DefaultCastAs(LogicalType::BOOLEAN));
			if (!read_write) {
				access_mode = AccessMode::READ_ONLY;
			} else {
				access_mode = AccessMode::READ_WRITE;
			}
			continue;
		}

		if (entry.first == "type") {
			// Extract the database type.
			db_type = StringValue::Get(entry.second.DefaultCastAs(LogicalType::VARCHAR));
			continue;
		}

		if (entry.first == "default_table") {
			default_table = QualifiedName::Parse(StringValue::Get(entry.second.DefaultCastAs(LogicalType::VARCHAR)));
			continue;
		}

		options[entry.first] = entry.second;
	}
}